

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O3

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t y;
  size_t x;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  array<vec<2UL,_double>,_3UL> pts2;
  vec3f bc_screen;
  TGAColor local_188;
  int local_180;
  int local_17c;
  undefined1 local_178 [16];
  double local_168;
  size_t local_158;
  ulong local_150;
  TGAImage *local_148;
  Model *local_140;
  IShader *local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8 [7];
  undefined8 uStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  lVar3 = 0;
  do {
    uVar1 = *(undefined8 *)((long)pts._M_elems[0].data + lVar3 * 2 + 8);
    *(undefined8 *)((long)local_f8 + lVar3) =
         *(undefined8 *)((long)pts._M_elems[0].data + lVar3 * 2);
    *(undefined8 *)((long)local_f8 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x30);
  lVar3 = 0;
  auVar6 = _DAT_001072a0;
  auVar8 = _DAT_00107290;
  do {
    uVar1 = *(undefined8 *)((long)pts._M_elems[0].data + lVar3 + 0x18);
    auVar5._8_8_ = uVar1;
    auVar5._0_8_ = uVar1;
    auVar5 = divpd(*(undefined1 (*) [16])((long)pts._M_elems[0].data + lVar3),auVar5);
    auVar8 = maxpd(auVar5,auVar8);
    auVar6 = minpd(auVar5,auVar6);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x60);
  local_188.bytespp = '\0';
  local_188.bgra[0] = '\0';
  local_188.bgra[1] = '\0';
  local_188.bgra[2] = '\0';
  local_188.bgra[3] = '\0';
  if ((int)auVar6._0_8_ <= (int)auVar8._0_8_) {
    local_17c = (int)auVar6._8_8_;
    local_150 = (ulong)(uint)(int)auVar8._8_8_;
    local_108 = local_f8[0];
    local_110 = local_f8[1];
    local_118 = local_f8[2];
    local_120 = local_f8[3];
    local_128 = local_f8[4];
    local_130 = local_f8[5];
    local_158 = (size_t)local_17c;
    x = (size_t)(int)auVar6._0_8_;
    local_180 = (int)auVar8._0_8_ + 1;
    local_78 = pts._M_elems[2].data[2];
    dStack_70 = pts._M_elems[2].data[3];
    local_88 = pts._M_elems[2].data[3];
    dStack_80 = pts._M_elems[2].data[3];
    local_58 = pts._M_elems[0].data[2];
    dStack_50 = pts._M_elems[0].data[3];
    local_68 = pts._M_elems[1].data[2];
    dStack_60 = pts._M_elems[1].data[3];
    local_98 = pts._M_elems[0].data[3];
    dStack_90 = pts._M_elems[1].data[3];
    local_148 = image;
    local_140 = model;
    local_138 = shader;
    do {
      if (local_17c <= (int)local_150) {
        local_100 = (double)(int)x;
        y = local_158;
        do {
          P.y = (double)(int)y;
          A.y = local_110;
          A.x = local_108;
          B.y = local_120;
          B.x = local_118;
          C.y = local_130;
          C.x = local_128;
          P.x = local_100;
          barycentric((vec3f *)local_48,A,B,C,P);
          dVar7 = local_48._0_8_;
          dVar9 = local_48._8_8_;
          auVar6._8_8_ = dStack_90;
          auVar6._0_8_ = local_98;
          auVar6 = divpd(local_48,auVar6);
          local_178 = auVar6;
          local_168 = local_38 / local_88;
          lVar3 = -1;
          do {
            lVar4 = (ulong)(lVar3 != 0) * 8 + 8;
            if (lVar3 == 1) {
              lVar4 = 0;
            }
            *(double *)(local_178 + lVar4) =
                 *(double *)(local_178 + lVar4) /
                 (auVar6._8_8_ + auVar6._0_8_ + local_38 / local_88);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 2);
          dVar11 = local_38 * dStack_70 + dVar7 * dStack_50 + dVar9 * dStack_60;
          dVar10 = (local_38 * local_78 + dVar7 * local_58 + dVar9 * local_68) / dVar11 + 0.5;
          if (255.0 <= dVar10) {
            dVar10 = 255.0;
          }
          if (((0.0 <= dVar7) && (0.0 <= dVar9)) && (0.0 <= local_38)) {
            if (dVar10 <= 0.0) {
              dVar10 = 0.0;
            }
            if ((zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[zbuffer->width * x + y] <= dVar10) {
              local_f8[6] = (double)local_178._0_8_;
              uStack_c0 = local_178._8_8_;
              local_b8 = local_168;
              local_a8 = dVar10;
              dStack_a0 = dVar11;
              iVar2 = (*local_138->_vptr_IShader[3])(local_138,local_140,&local_188);
              if ((char)iVar2 == '\0') {
                (zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[zbuffer->width * x + y] = local_a8;
                TGAImage::set(local_148,x,y,&local_188);
              }
            }
          }
          y = y + 1;
        } while ((int)auVar8._8_8_ + 1U != (int)y);
      }
      x = x + 1;
    } while (local_180 != (int)x);
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    std::array<vec2f, 3> pts2;
    for (int i = 0; i < 3; i++) pts2[i] = proj<2>(pts[i]);

    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f bc_screen = barycentric(pts2[0], pts2[1], pts2[2], to_f(P));
            vec3f bc_clip =
                vec3f(bc_screen.x / pts[0][3], bc_screen.y / pts[1][3], bc_screen.z / pts[2][3]);
            bc_clip = bc_clip / (bc_clip.x + bc_clip.y + bc_clip.z);
            double z = pts[0][2] * bc_screen.x + pts[1][2] * bc_screen.y + pts[2][2] * bc_screen.z;
            double w = pts[0][3] * bc_screen.x + pts[1][3] * bc_screen.y + pts[2][3] * bc_screen.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0 ||
                zbuffer.get(P.x, P.y) > frag_depth)
                continue;
            bool discard = shader.fragment(model, bc_clip, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}